

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall Omega_h::Read<int>::Read(Read<int> *this,initializer_list<int> l,string *name_in)

{
  void *__buf;
  Write<int> local_30;
  Write<int> local_20;
  
  HostWrite<int>::HostWrite((HostWrite<int> *)&local_20,l,name_in);
  HostWrite<int>::write((HostWrite<int> *)&local_30,(int)&local_20,__buf,(size_t)name_in);
  Write<int>::Write(&this->write_,&local_30);
  Write<int>::~Write(&local_30);
  Write<int>::~Write(&local_20);
  return;
}

Assistant:

Read<T>::Read(std::initializer_list<T> l, std::string const& name_in)
    : Read<T>(HostWrite<T>(l, name_in).write()) {}